

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::uintwide_t<11264U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
shl<unsigned_int>(uintwide_t<11264U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,uint n
                 )

{
  uint uVar1;
  pointer pvVar2;
  sbyte sVar3;
  ulong uVar4;
  uint *puVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  
  uVar4 = 0x160;
  if ((ulong)(n >> 5) < 0x160) {
    uVar4 = (ulong)(n >> 5);
  }
  if (0x1f < n) {
    pvVar2 = (this->values).
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elems;
    uVar6 = (ulong)(uint)((int)uVar4 * 4);
    for (lVar7 = 0; uVar6 - 0x580 != lVar7; lVar7 = lVar7 + -4) {
      *(undefined4 *)((long)pvVar2 + lVar7 + 0x57c) =
           *(undefined4 *)((long)pvVar2 + lVar7 + (0x57c - uVar6));
    }
    for (uVar6 = 0; (uint)((int)uVar4 * 4) != uVar6; uVar6 = uVar6 + 4) {
      *(undefined4 *)((long)pvVar2 + uVar6) = 0;
    }
  }
  if ((n & 0x1f) != 0) {
    pvVar2 = (this->values).
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elems;
    sVar3 = (sbyte)(n & 0x1f);
    uVar8 = 0;
    for (puVar5 = pvVar2 + uVar4;
        puVar5 != pvVar2 + (this->values).
                           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                           .elem_count; puVar5 = puVar5 + 1) {
      uVar1 = *puVar5;
      *puVar5 = uVar1 << sVar3 | uVar8;
      uVar8 = uVar1 >> (0x20U - sVar3 & 0x1f);
    }
  }
  return;
}

Assistant:

constexpr auto shl(IntegralType n) -> void
    {
      const auto offset =
        (detail::min_unsafe)(static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) / static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits)),
                             static_cast<unsigned_fast_type>(number_of_limbs));

      const auto left_shift_amount = static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) % static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits));

      if(offset > static_cast<unsigned_fast_type>(UINT8_C(0)))
      {
        detail::copy_backward_unsafe(values.cbegin(),
                                     detail::advance_and_point(values.cbegin(), static_cast<size_t>(number_of_limbs - offset)),
                                     detail::advance_and_point(values.begin(), static_cast<size_t>(number_of_limbs)));

        detail::fill_unsafe(values.begin(), detail::advance_and_point(values.begin(), static_cast<size_t>(offset)), static_cast<limb_type>(UINT8_C(0)));
      }

      using local_integral_type = unsigned_fast_type;

      if(left_shift_amount != static_cast<local_integral_type>(UINT8_C(0)))
      {
        auto part_from_previous_value = static_cast<limb_type>(UINT8_C(0));

        auto ai = detail::advance_and_point(values.begin(), offset); // NOLINT(llvm-qualified-auto,readability-qualified-auto)

        while(ai != values.end()) // NOLINT(altera-id-dependent-backward-branch)
        {
          const auto t = *ai;

          *ai++ =
            static_cast<limb_type>
            (
                static_cast<limb_type>(t << static_cast<local_integral_type>(left_shift_amount))
              | part_from_previous_value
            );

          const auto right_shift_previous_value =
            static_cast<local_integral_type>
            (
              static_cast<unsigned_fast_type>
              (
                  static_cast<std::int_fast32_t>(std::numeric_limits<limb_type>::digits)
                - static_cast<std::int_fast32_t>(left_shift_amount)
              )
            );

          part_from_previous_value = static_cast<limb_type>(t >> right_shift_previous_value);
        }
      }
    }